

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O2

string * __thiscall
FIX::UtcTimeOnlyConvertor::convert_abi_cxx11_
          (string *__return_storage_ptr__,UtcTimeOnlyConvertor *this,UtcTimeOnly *value,
          int precision)

{
  int iVar1;
  int fraction;
  int second;
  int minute;
  int hour;
  int precision_local;
  char result [18];
  
  result[0] = '\0';
  result[1] = '\0';
  result[2] = '\0';
  result[3] = '\0';
  precision_local = (int)value;
  hour = 9;
  precision_local = clamp_of<int>(&precision_local,(int *)result,&hour);
  DateTime::getHMS((DateTime *)this,&hour,&minute,&second,&fraction,precision_local);
  integer_to_string_padded(result,2,hour,'0');
  result[2] = ':';
  integer_to_string_padded(result + 3,2,minute,'0');
  result[5] = ':';
  integer_to_string_padded(result + 6,2,second,'0');
  if ((long)precision_local != 0) {
    result[8] = '.';
    integer_to_string_padded(result + 9,(long)precision_local,fraction,'0');
    if (precision_local != 0) {
      iVar1 = precision_local + 9;
      goto LAB_0026be4e;
    }
  }
  iVar1 = 8;
LAB_0026be4e:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,result,result + iVar1);
  return __return_storage_ptr__;
}

Assistant:

static std::string convert( const UtcTimeOnly& value,
                              int precision = 0 )
  EXCEPT ( FieldConvertError )
  {
    char result[ 8+10 ]; // Maximum
    int hour, minute, second, fraction;

    precision = clamp_of( precision, 0, 9 );

    value.getHMS( hour, minute, second, fraction, precision );

    integer_to_string_padded ( result, 2, hour );
    result[2] = ':';
    integer_to_string_padded ( result + 3, 2, minute );
    result[5] = ':';
    integer_to_string_padded ( result + 6, 2, second );

    if( precision )
    {
      result[8] = '.';
      integer_to_string_padded ( result + 9, precision, fraction );
    }

    return std::string(result, precision ? (8 + 1 + precision) : 8);
  }